

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_connecter.cpp
# Opt level: O2

int __thiscall zmq::tcp_connecter_t::open(tcp_connecter_t *this,char *__file,int __oflag,...)

{
  void *pvVar1;
  bool bVar2;
  fd_t s_;
  int iVar3;
  socklen_t sVar4;
  tcp_address_t *ptVar5;
  address_t *paVar6;
  sockaddr *psVar7;
  int *piVar8;
  char *errmsg_;
  int iVar9;
  int flag;
  
  if ((this->super_stream_connecter_base_t)._s != -1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_s == retired_fd",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tcp_connecter.cpp"
            ,0xb0);
    fflush(_stderr);
    zmq_abort("_s == retired_fd");
  }
  pvVar1 = (((this->super_stream_connecter_base_t)._addr)->resolved).dummy;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,0x3c);
    (((this->super_stream_connecter_base_t)._addr)->resolved).dummy = (void *)0x0;
  }
  ptVar5 = (tcp_address_t *)operator_new(0x3c,(nothrow_t *)&std::nothrow);
  if (ptVar5 != (tcp_address_t *)0x0) {
    tcp_address_t::tcp_address_t(ptVar5);
  }
  (((this->super_stream_connecter_base_t)._addr)->resolved).tcp_addr = ptVar5;
  paVar6 = (this->super_stream_connecter_base_t)._addr;
  ptVar5 = (paVar6->resolved).tcp_addr;
  if (ptVar5 == (tcp_address_t *)0x0) {
    fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tcp_connecter.cpp"
            ,0xb8);
    fflush(_stderr);
    zmq_abort("FATAL ERROR: OUT OF MEMORY");
    paVar6 = (this->super_stream_connecter_base_t)._addr;
    ptVar5 = (paVar6->resolved).tcp_addr;
  }
  s_ = tcp_open_socket((paVar6->address)._M_dataplus._M_p,
                       &(this->super_stream_connecter_base_t).super_own_t.options,false,true,ptVar5)
  ;
  (this->super_stream_connecter_base_t)._s = s_;
  pvVar1 = (((this->super_stream_connecter_base_t)._addr)->resolved).dummy;
  if (s_ == -1) {
    operator_delete(pvVar1,0x3c);
    (((this->super_stream_connecter_base_t)._addr)->resolved).dummy = (void *)0x0;
    iVar9 = -1;
  }
  else {
    if (pvVar1 == (void *)0x0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_addr->resolved.tcp_addr != NULL",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tcp_connecter.cpp"
              ,0xc1);
      fflush(_stderr);
      zmq_abort("_addr->resolved.tcp_addr != NULL");
      s_ = (this->super_stream_connecter_base_t)._s;
    }
    unblock_socket(s_);
    ptVar5 = (((this->super_stream_connecter_base_t)._addr)->resolved).tcp_addr;
    bVar2 = tcp_address_t::has_src_addr(ptVar5);
    iVar9 = -1;
    if (bVar2) {
      flag = 1;
      iVar3 = setsockopt((this->super_stream_connecter_base_t)._s,1,2,&flag,4);
      if (iVar3 != 0) {
        piVar8 = __errno_location();
        errmsg_ = strerror(*piVar8);
        fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tcp_connecter.cpp"
                ,0xd9);
        fflush(_stderr);
        zmq_abort(errmsg_);
      }
      iVar3 = (this->super_stream_connecter_base_t)._s;
      psVar7 = tcp_address_t::src_addr(ptVar5);
      sVar4 = tcp_address_t::src_addrlen(ptVar5);
      iVar3 = bind(iVar3,(sockaddr *)psVar7,sVar4);
      if (iVar3 == -1) {
        return -1;
      }
    }
    iVar3 = (this->super_stream_connecter_base_t)._s;
    psVar7 = tcp_address_t::addr(ptVar5);
    sVar4 = tcp_address_t::addrlen(ptVar5);
    iVar3 = ::connect(iVar3,(sockaddr *)psVar7,sVar4);
    if (iVar3 == 0) {
      iVar9 = 0;
    }
    else {
      piVar8 = __errno_location();
      if (*piVar8 == 4) {
        *piVar8 = 0x73;
      }
    }
  }
  return iVar9;
}

Assistant:

int zmq::tcp_connecter_t::open ()
{
    zmq_assert (_s == retired_fd);

    //  Resolve the address
    if (_addr->resolved.tcp_addr != NULL) {
        LIBZMQ_DELETE (_addr->resolved.tcp_addr);
    }

    _addr->resolved.tcp_addr = new (std::nothrow) tcp_address_t ();
    alloc_assert (_addr->resolved.tcp_addr);
    _s = tcp_open_socket (_addr->address.c_str (), options, false, true,
                          _addr->resolved.tcp_addr);
    if (_s == retired_fd) {
        //  TODO we should emit some event in this case!

        LIBZMQ_DELETE (_addr->resolved.tcp_addr);
        return -1;
    }
    zmq_assert (_addr->resolved.tcp_addr != NULL);

    // Set the socket to non-blocking mode so that we get async connect().
    unblock_socket (_s);

    const tcp_address_t *const tcp_addr = _addr->resolved.tcp_addr;

    int rc;

    // Set a source address for conversations
    if (tcp_addr->has_src_addr ()) {
        //  Allow reusing of the address, to connect to different servers
        //  using the same source port on the client.
        int flag = 1;
#ifdef ZMQ_HAVE_WINDOWS
        rc = setsockopt (_s, SOL_SOCKET, SO_REUSEADDR,
                         reinterpret_cast<const char *> (&flag), sizeof (int));
        wsa_assert (rc != SOCKET_ERROR);
#elif defined ZMQ_HAVE_VXWORKS
        rc = setsockopt (_s, SOL_SOCKET, SO_REUSEADDR, (char *) &flag,
                         sizeof (int));
        errno_assert (rc == 0);
#else
        rc = setsockopt (_s, SOL_SOCKET, SO_REUSEADDR, &flag, sizeof (int));
        errno_assert (rc == 0);
#endif

#if defined ZMQ_HAVE_VXWORKS
        rc = ::bind (_s, (sockaddr *) tcp_addr->src_addr (),
                     tcp_addr->src_addrlen ());
#else
        rc = ::bind (_s, tcp_addr->src_addr (), tcp_addr->src_addrlen ());
#endif
        if (rc == -1)
            return -1;
    }

    //  Connect to the remote peer.
#if defined ZMQ_HAVE_VXWORKS
    rc = ::connect (_s, (sockaddr *) tcp_addr->addr (), tcp_addr->addrlen ());
#else
    rc = ::connect (_s, tcp_addr->addr (), tcp_addr->addrlen ());
#endif
    //  Connect was successful immediately.
    if (rc == 0) {
        return 0;
    }

    //  Translate error codes indicating asynchronous connect has been
    //  launched to a uniform EINPROGRESS.
#ifdef ZMQ_HAVE_WINDOWS
    const int last_error = WSAGetLastError ();
    if (last_error == WSAEINPROGRESS || last_error == WSAEWOULDBLOCK)
        errno = EINPROGRESS;
    else
        errno = wsa_error_to_errno (last_error);
#else
    if (errno == EINTR)
        errno = EINPROGRESS;
#endif
    return -1;
}